

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

array * cs_impl::string_cs_ext::split(array *__return_storage_ptr__,string *str,array *signals)

{
  char cVar1;
  _Elt_pointer paVar2;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *this;
  char *pcVar3;
  _Elt_pointer paVar4;
  char *ch;
  char *pcVar5;
  _Elt_pointer this_00;
  _Map_pointer ppaVar6;
  string buf;
  array arr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *local_98;
  array *local_90;
  char *local_88;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_80;
  
  local_98 = &__return_storage_ptr__->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>
  ;
  local_90 = signals;
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base(&local_80);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  pcVar5 = (str->_M_dataplus)._M_p;
  local_88 = pcVar5 + str->_M_string_length;
  do {
    this = local_98;
    if (pcVar5 == local_88) {
      if (local_b8._M_string_length != 0) {
        std::deque<cs_impl::any,std::allocator<cs_impl::any>>::emplace_back<std::__cxx11::string&>
                  ((deque<cs_impl::any,std::allocator<cs_impl::any>> *)&local_80,&local_b8);
      }
      std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base(this,&local_80);
      std::__cxx11::string::~string((string *)&local_b8);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_80);
      return (array *)this;
    }
    this_00 = (local_90->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    paVar4 = (local_90->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppaVar6 = (local_90->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    paVar2 = (local_90->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    while (cVar1 = *pcVar5, this_00 != paVar2) {
      pcVar3 = any::const_val<char>(this_00);
      if (cVar1 == *pcVar3) {
        if (local_b8._M_string_length != 0) {
          std::deque<cs_impl::any,std::allocator<cs_impl::any>>::emplace_back<std::__cxx11::string&>
                    ((deque<cs_impl::any,std::allocator<cs_impl::any>> *)&local_80,&local_b8);
          local_b8._M_string_length = 0;
          *local_b8._M_dataplus._M_p = '\0';
        }
        goto LAB_0018e41b;
      }
      this_00 = this_00 + 1;
      if (this_00 == paVar4) {
        this_00 = ppaVar6[1];
        ppaVar6 = ppaVar6 + 1;
        paVar4 = this_00 + 0x40;
      }
    }
    std::__cxx11::string::push_back((char)&local_b8);
LAB_0018e41b:
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

array split(const string &str, const array &signals)
		{
			array
			arr;
			string buf;
			bool found = false;
			for (auto &ch: str) {
				for (auto &sig: signals) {
					if (ch == sig.const_val<char>()) {
						if (!buf.empty()) {
							arr.emplace_back(buf);
							buf.clear();
						}
						found = true;
						break;
					}
				}
				if (found)
					found = false;
				else
					buf.push_back(ch);
			}
			if (!buf.empty())
				arr.emplace_back(buf);
			return std::move(arr);
		}